

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseAssembler::onAttach(BaseAssembler *this,CodeHolder *code)

{
  Error EVar1;
  Section **ppSVar2;
  ZoneVector<asmjit::v1_14::Section_*> *in_RSI;
  BaseAssembler *in_RDI;
  BaseEmitter *unaff_retaddr;
  Error _err;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  EVar1 = BaseEmitter::onAttach
                    (unaff_retaddr,
                     (CodeHolder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (EVar1 == 0) {
    ppSVar2 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                        (in_RSI,(ulong)in_stack_ffffffffffffffe0);
    BaseAssembler_initSection(in_RDI,*ppSVar2);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error BaseAssembler::onAttach(CodeHolder* code) noexcept {
  ASMJIT_PROPAGATE(Base::onAttach(code));

  // Attach to the end of the .text section.
  BaseAssembler_initSection(this, code->_sections[0]);

  return kErrorOk;
}